

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

int Io_BlifParseConstruct(Io_BlifMan_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  void *pvVar5;
  uint *puVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar9;
  int local_44;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pObj;
  Io_BlifObj_t *pObjIoInput;
  Io_BlifObj_t *pObjIo;
  Abc_Ntk_t *pAig;
  Io_BlifMan_t *p_local;
  
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  p->pAig = pNtk;
  pcVar4 = Extra_UtilStrsav(p->pModel);
  pNtk->pName = pcVar4;
  pcVar4 = Extra_UtilStrsav(p->pFileName);
  pNtk->pSpec = pcVar4;
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vPis), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar5 = Vec_PtrEntry(p->vPis,local_44);
    pAVar7 = Abc_NtkCreatePi(pNtk);
    Abc_ObjAssignName(pAVar7,*(char **)((long)pvVar5 + 8),(char *)0x0);
    *(Abc_Obj_t **)((long)pvVar5 + 0x10) = pAVar7;
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vPos), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar5 = Vec_PtrEntry(p->vPos,local_44);
    pAVar7 = Abc_NtkCreatePo(pNtk);
    Abc_ObjAssignName(pAVar7,*(char **)((long)pvVar5 + 8),(char *)0x0);
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vLos), local_44 < iVar1; local_44 = local_44 + 1) {
    puVar6 = (uint *)Vec_PtrEntry(p->vLos,local_44);
    pAVar7 = Abc_NtkCreateBi(pNtk);
    pvVar5 = Vec_PtrEntry(p->vLis,local_44);
    Abc_ObjAssignName(pAVar7,*(char **)((long)pvVar5 + 8),(char *)0x0);
    pAVar8 = Abc_NtkCreateLatch(pNtk);
    aVar9._4_4_ = 0;
    aVar9.iData = *puVar6 >> 6 & 3;
    pAVar8->field_5 = aVar9;
    Abc_ObjAssignName(pAVar8,*(char **)(puVar6 + 2),"L");
    Abc_ObjAddFanin(pAVar8,pAVar7);
    pAVar7 = Abc_NtkCreateBo(pNtk);
    Abc_ObjAssignName(pAVar7,*(char **)(puVar6 + 2),(char *)0x0);
    Abc_ObjAddFanin(pAVar7,pAVar8);
    *(Abc_Obj_t **)(puVar6 + 4) = pAVar7;
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vPos), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar5 = Vec_PtrEntry(p->vPos,local_44);
    pAVar7 = Io_BlifParseConstruct_rec(p,*(char **)((long)pvVar5 + 8));
    if (pAVar7 == (Abc_Obj_t *)0x0) {
      return 0;
    }
    pAVar8 = Abc_NtkPo(p->pAig,local_44);
    Abc_ObjAddFanin(pAVar8,pAVar7);
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vLis);
    if (iVar1 <= local_44) {
      iVar1 = Vec_PtrSize(p->vNames);
      p->nTablesLeft = iVar1 - p->nTablesRead;
      if (p->nTablesLeft != 0) {
        printf("The number of dangling tables = %d.\n",(ulong)(uint)p->nTablesLeft);
      }
      uVar2 = Abc_NtkNodeNum(p->pAig);
      uVar3 = Io_BlifEstimateAndNum(p);
      printf("AND nodes = %6d.  Estimate = %6d.\n",(ulong)uVar2,(ulong)uVar3);
      return 1;
    }
    pvVar5 = Vec_PtrEntry(p->vLis,local_44);
    pAVar7 = Io_BlifParseConstruct_rec(p,*(char **)((long)pvVar5 + 8));
    if (pAVar7 == (Abc_Obj_t *)0x0) break;
    pAVar8 = Abc_NtkBox(p->pAig,local_44);
    pAVar8 = Abc_ObjFanin0(pAVar8);
    Abc_ObjAddFanin(pAVar8,pAVar7);
    local_44 = local_44 + 1;
  }
  return 0;
}

Assistant:

static int Io_BlifParseConstruct( Io_BlifMan_t * p )
{
    Abc_Ntk_t * pAig;
    Io_BlifObj_t * pObjIo, * pObjIoInput;
    Abc_Obj_t * pObj, * pLatch;
    int i;
    // allocate the empty AIG
    pAig = p->pAig = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pAig->pName = Extra_UtilStrsav( p->pModel );
    pAig->pSpec = Extra_UtilStrsav( p->pFileName );
    // create PIs
    Vec_PtrForEachEntry( Io_BlifObj_t *, p->vPis, pObjIo, i )
    {
        pObj = Abc_NtkCreatePi( pAig );
        Abc_ObjAssignName( pObj, pObjIo->pName, NULL );
        pObjIo->pEquiv = pObj;
    }
    // create POs
    Vec_PtrForEachEntry( Io_BlifObj_t *, p->vPos, pObjIo, i )
    {
        pObj = Abc_NtkCreatePo( pAig );
        Abc_ObjAssignName( pObj, pObjIo->pName, NULL );
    }
    // create latches
    Vec_PtrForEachEntry( Io_BlifObj_t *, p->vLos, pObjIo, i )
    {
        // add the latch input terminal
        pObj = Abc_NtkCreateBi( pAig );
        pObjIoInput = (Io_BlifObj_t *)Vec_PtrEntry( p->vLis, i );
        Abc_ObjAssignName( pObj, pObjIoInput->pName, NULL );
        
        // add the latch box
        pLatch = Abc_NtkCreateLatch( pAig );
        pLatch->pData = (void *)(ABC_PTRUINT_T)pObjIo->Init;
        Abc_ObjAssignName( pLatch, pObjIo->pName, "L" );
        Abc_ObjAddFanin( pLatch, pObj  );

        // add the latch output terminal
        pObj = Abc_NtkCreateBo( pAig );
        Abc_ObjAssignName( pObj, pObjIo->pName, NULL );
        Abc_ObjAddFanin( pObj, pLatch );
        // set the value of the latch output
//        pObjIo->pEquiv = Abc_ObjNotCond( pObj, pObjIo->Init );
        pObjIo->pEquiv = pObj;
    }
    // traverse the nodes from the POs
    Vec_PtrForEachEntry( Io_BlifObj_t *, p->vPos, pObjIo, i )
    {
        pObj = Io_BlifParseConstruct_rec( p, pObjIo->pName );
        if ( pObj == NULL )
            return 0;
        Abc_ObjAddFanin( Abc_NtkPo(p->pAig, i), pObj );
    }
    // traverse the nodes from the latch inputs
    Vec_PtrForEachEntry( Io_BlifObj_t *, p->vLis, pObjIo, i )
    {
        pObj = Io_BlifParseConstruct_rec( p, pObjIo->pName );
        if ( pObj == NULL )
            return 0;
//        pObj = Abc_ObjNotCond( pObj, pObjIo->Init );
        Abc_ObjAddFanin( Abc_ObjFanin0(Abc_NtkBox(p->pAig, i)), pObj );
    }
    p->nTablesLeft = Vec_PtrSize(p->vNames) - p->nTablesRead; 
    if ( p->nTablesLeft ) 
        printf( "The number of dangling tables = %d.\n", p->nTablesLeft );
    printf( "AND nodes = %6d.  Estimate = %6d.\n", Abc_NtkNodeNum(p->pAig), Io_BlifEstimateAndNum(p) );
    return 1;
}